

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-game.c
# Opt level: O3

size_t cmd_list_lookup_by_name(char *name)

{
  int iVar1;
  size_t i;
  size_t sVar2;
  command_list *pcVar3;
  
  pcVar3 = cmds_all;
  sVar2 = 0;
  do {
    iVar1 = strcmp(pcVar3->name,name);
    if (iVar1 == 0) {
      return sVar2;
    }
    sVar2 = sVar2 + 1;
    pcVar3 = pcVar3 + 1;
  } while (sVar2 != 0x11);
  return 0xfffffffffffffffe;
}

Assistant:

size_t cmd_list_lookup_by_name(const char *name)
{
	size_t i = 0;

	while (1) {
		if (i >= (int) N_ELEMENTS(cmds_all)) {
			/*
			 * Return a negative value other than -1 to prevent
			 * future lookups for the same name by ui-context.c.
			 * Those lookups are guaranteed to fail since the
			 * names in cmds_all don't change.
			 */
			return -2;
		}
		if (streq(cmds_all[i].name, name)) {
			return i;
		}
		++i;
	}
}